

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O1

void ggml_vec_dot_iq2_s_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar8 [32];
  
  if (n < 0x100) {
    auVar5 = vshufpd_avx(ZEXT816(0),ZEXT816(0),1);
    auVar11._0_4_ = auVar5._0_4_ + 0.0;
    auVar11._4_4_ = auVar5._4_4_ + 0.0;
    auVar11._8_4_ = auVar5._8_4_ + 0.0;
    auVar11._12_4_ = auVar5._12_4_ + 0.0;
    auVar5 = vhaddps_avx(auVar11,auVar11);
    *s = auVar5._0_4_ * 0.125;
    return;
  }
  auVar6[8] = 0x1e;
  auVar6._0_8_ = 0x1e1e1e1e1e1e1e1e;
  auVar6[9] = 0x1e;
  auVar6[10] = 0x1e;
  auVar6[0xb] = 0x1e;
  auVar6[0xc] = 0x1e;
  auVar6[0xd] = 0x1e;
  auVar6[0xe] = 0x1e;
  auVar6[0xf] = 0x1e;
  auVar12[8] = 1;
  auVar12._0_8_ = 0x101010101010101;
  auVar12[9] = 1;
  auVar12[10] = 1;
  auVar12[0xb] = 1;
  auVar12[0xc] = 1;
  auVar12[0xd] = 1;
  auVar12[0xe] = 1;
  auVar12[0xf] = 1;
  auVar13._8_8_ = 0x8040201008040201;
  auVar13._0_8_ = 0x8040201008040201;
  auVar13._16_8_ = 0x8040201008040201;
  auVar13._24_8_ = 0x8040201008040201;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)((long)vx + 0x4a);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)((long)vx + 0x4a) >> 4;
  auVar5 = vpunpcklqdq_avx(auVar5,auVar14);
  auVar5 = vpaddw_avx(auVar5,auVar5);
  auVar5 = vpternlogq_avx512vl(auVar5,auVar12,auVar6,0xec);
  auVar3 = vpmovzxbw_avx2(auVar5);
  bVar1 = *(byte *)((long)vx + 0x42);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = iq2s_grid[CONCAT31((int3)((uint)bVar1 * 4 >> 8),*(undefined1 *)((long)vx + 5))];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = iq2s_grid[(bVar1 & 0x30) << 4 | (uint)*(byte *)((long)vx + 4)];
  auVar5 = vpunpcklqdq_avx(auVar17,auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = iq2s_grid[(bVar1 & 0xc) << 6 | (uint)*(byte *)((long)vx + 3)];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = iq2s_grid[(bVar1 & 3) << 8 | (uint)*(byte *)((long)vx + 2)];
  auVar6 = vpunpcklqdq_avx(auVar21,auVar18);
  bVar1 = *(byte *)((long)vx + 0x43);
  auVar16._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
  auVar16._16_16_ = ZEXT116(1) * auVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = iq2s_grid[CONCAT31((int3)((uint)bVar1 * 4 >> 8),*(undefined1 *)((long)vx + 9))];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = iq2s_grid[(bVar1 & 0x30) << 4 | (uint)*(byte *)((long)vx + 8)];
  auVar5 = vpunpcklqdq_avx(auVar22,auVar19);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = iq2s_grid[(bVar1 & 0xc) << 6 | (uint)*(byte *)((long)vx + 7)];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = iq2s_grid[(bVar1 & 3) << 8 | (uint)*(byte *)((long)vx + 6)];
  auVar6 = vpunpcklqdq_avx512vl(auVar24,auVar23);
  auVar20._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
  auVar20._16_16_ = ZEXT116(1) * auVar5;
  auVar7 = vpermb_avx512vl(_DAT_0014b9c0,ZEXT432(*(uint *)((long)vx + 0x22)));
  uVar4 = vptestnmb_avx512vl(auVar7,auVar13);
  auVar7 = vpsubb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                       *(undefined1 (*) [32])((long)vy + 4));
  auVar8 = vmovdqu8_avx512vl(*(undefined1 (*) [32])((long)vy + 4));
  bVar2 = (bool)((byte)uVar4 & 1);
  auVar9[0] = bVar2 * auVar8[0] | !bVar2 * auVar7[0];
  bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
  auVar9[1] = bVar2 * auVar8[1] | !bVar2 * auVar7[1];
  bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
  auVar9[2] = bVar2 * auVar8[2] | !bVar2 * auVar7[2];
  bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
  auVar9[3] = bVar2 * auVar8[3] | !bVar2 * auVar7[3];
  bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
  auVar9[4] = bVar2 * auVar8[4] | !bVar2 * auVar7[4];
  bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
  auVar9[5] = bVar2 * auVar8[5] | !bVar2 * auVar7[5];
  bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
  auVar9[6] = bVar2 * auVar8[6] | !bVar2 * auVar7[6];
  bVar2 = (bool)((byte)(uVar4 >> 7) & 1);
  auVar9[7] = bVar2 * auVar8[7] | !bVar2 * auVar7[7];
  bVar2 = (bool)((byte)(uVar4 >> 8) & 1);
  auVar9[8] = bVar2 * auVar8[8] | !bVar2 * auVar7[8];
  bVar2 = (bool)((byte)(uVar4 >> 9) & 1);
  auVar9[9] = bVar2 * auVar8[9] | !bVar2 * auVar7[9];
  bVar2 = (bool)((byte)(uVar4 >> 10) & 1);
  auVar9[10] = bVar2 * auVar8[10] | !bVar2 * auVar7[10];
  bVar2 = (bool)((byte)(uVar4 >> 0xb) & 1);
  auVar9[0xb] = bVar2 * auVar8[0xb] | !bVar2 * auVar7[0xb];
  bVar2 = (bool)((byte)(uVar4 >> 0xc) & 1);
  auVar9[0xc] = bVar2 * auVar8[0xc] | !bVar2 * auVar7[0xc];
  bVar2 = (bool)((byte)(uVar4 >> 0xd) & 1);
  auVar9[0xd] = bVar2 * auVar8[0xd] | !bVar2 * auVar7[0xd];
  bVar2 = (bool)((byte)(uVar4 >> 0xe) & 1);
  auVar9[0xe] = bVar2 * auVar8[0xe] | !bVar2 * auVar7[0xe];
  bVar2 = (bool)((byte)(uVar4 >> 0xf) & 1);
  auVar9[0xf] = bVar2 * auVar8[0xf] | !bVar2 * auVar7[0xf];
  bVar2 = (bool)((byte)(uVar4 >> 0x10) & 1);
  auVar9[0x10] = bVar2 * auVar8[0x10] | !bVar2 * auVar7[0x10];
  bVar2 = (bool)((byte)(uVar4 >> 0x11) & 1);
  auVar9[0x11] = bVar2 * auVar8[0x11] | !bVar2 * auVar7[0x11];
  bVar2 = (bool)((byte)(uVar4 >> 0x12) & 1);
  auVar9[0x12] = bVar2 * auVar8[0x12] | !bVar2 * auVar7[0x12];
  bVar2 = (bool)((byte)(uVar4 >> 0x13) & 1);
  auVar9[0x13] = bVar2 * auVar8[0x13] | !bVar2 * auVar7[0x13];
  bVar2 = (bool)((byte)(uVar4 >> 0x14) & 1);
  auVar9[0x14] = bVar2 * auVar8[0x14] | !bVar2 * auVar7[0x14];
  bVar2 = (bool)((byte)(uVar4 >> 0x15) & 1);
  auVar9[0x15] = bVar2 * auVar8[0x15] | !bVar2 * auVar7[0x15];
  bVar2 = (bool)((byte)(uVar4 >> 0x16) & 1);
  auVar9[0x16] = bVar2 * auVar8[0x16] | !bVar2 * auVar7[0x16];
  bVar2 = (bool)((byte)(uVar4 >> 0x17) & 1);
  auVar9[0x17] = bVar2 * auVar8[0x17] | !bVar2 * auVar7[0x17];
  bVar2 = (bool)((byte)(uVar4 >> 0x18) & 1);
  auVar9[0x18] = bVar2 * auVar8[0x18] | !bVar2 * auVar7[0x18];
  bVar2 = (bool)((byte)(uVar4 >> 0x19) & 1);
  auVar9[0x19] = bVar2 * auVar8[0x19] | !bVar2 * auVar7[0x19];
  bVar2 = (bool)((byte)(uVar4 >> 0x1a) & 1);
  auVar9[0x1a] = bVar2 * auVar8[0x1a] | !bVar2 * auVar7[0x1a];
  bVar2 = (bool)((byte)(uVar4 >> 0x1b) & 1);
  auVar9[0x1b] = bVar2 * auVar8[0x1b] | !bVar2 * auVar7[0x1b];
  bVar2 = (bool)((byte)(uVar4 >> 0x1c) & 1);
  auVar9[0x1c] = bVar2 * auVar8[0x1c] | !bVar2 * auVar7[0x1c];
  bVar2 = (bool)((byte)(uVar4 >> 0x1d) & 1);
  auVar9._30_2_ = auVar8._30_2_;
  auVar9[0x1d] = bVar2 * auVar8[0x1d] | !bVar2 * auVar7[0x1d];
  vpmaddubsw_avx2(auVar16,auVar9);
  auVar7 = vpermb_avx512vl(_DAT_0014b9c0,ZEXT432(*(uint *)((long)vx + 0x26)));
  uVar4 = vptestnmb_avx512vl(auVar7,auVar13);
  auVar7 = vpsubb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                       *(undefined1 (*) [32])((long)vy + 0x24));
  auVar8 = vmovdqu8_avx512vl(*(undefined1 (*) [32])((long)vy + 0x24));
  bVar2 = (bool)((byte)uVar4 & 1);
  auVar10[0] = bVar2 * auVar8[0] | !bVar2 * auVar7[0];
  bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
  auVar10[1] = bVar2 * auVar8[1] | !bVar2 * auVar7[1];
  bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
  auVar10[2] = bVar2 * auVar8[2] | !bVar2 * auVar7[2];
  bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
  auVar10[3] = bVar2 * auVar8[3] | !bVar2 * auVar7[3];
  bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
  auVar10[4] = bVar2 * auVar8[4] | !bVar2 * auVar7[4];
  bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
  auVar10[5] = bVar2 * auVar8[5] | !bVar2 * auVar7[5];
  bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
  auVar10[6] = bVar2 * auVar8[6] | !bVar2 * auVar7[6];
  bVar2 = (bool)((byte)(uVar4 >> 7) & 1);
  auVar10[7] = bVar2 * auVar8[7] | !bVar2 * auVar7[7];
  bVar2 = (bool)((byte)(uVar4 >> 8) & 1);
  auVar10[8] = bVar2 * auVar8[8] | !bVar2 * auVar7[8];
  bVar2 = (bool)((byte)(uVar4 >> 9) & 1);
  auVar10[9] = bVar2 * auVar8[9] | !bVar2 * auVar7[9];
  bVar2 = (bool)((byte)(uVar4 >> 10) & 1);
  auVar10[10] = bVar2 * auVar8[10] | !bVar2 * auVar7[10];
  bVar2 = (bool)((byte)(uVar4 >> 0xb) & 1);
  auVar10[0xb] = bVar2 * auVar8[0xb] | !bVar2 * auVar7[0xb];
  bVar2 = (bool)((byte)(uVar4 >> 0xc) & 1);
  auVar10[0xc] = bVar2 * auVar8[0xc] | !bVar2 * auVar7[0xc];
  bVar2 = (bool)((byte)(uVar4 >> 0xd) & 1);
  auVar10[0xd] = bVar2 * auVar8[0xd] | !bVar2 * auVar7[0xd];
  bVar2 = (bool)((byte)(uVar4 >> 0xe) & 1);
  auVar10[0xe] = bVar2 * auVar8[0xe] | !bVar2 * auVar7[0xe];
  bVar2 = (bool)((byte)(uVar4 >> 0xf) & 1);
  auVar10[0xf] = bVar2 * auVar8[0xf] | !bVar2 * auVar7[0xf];
  bVar2 = (bool)((byte)(uVar4 >> 0x10) & 1);
  auVar10[0x10] = bVar2 * auVar8[0x10] | !bVar2 * auVar7[0x10];
  bVar2 = (bool)((byte)(uVar4 >> 0x11) & 1);
  auVar10[0x11] = bVar2 * auVar8[0x11] | !bVar2 * auVar7[0x11];
  bVar2 = (bool)((byte)(uVar4 >> 0x12) & 1);
  auVar10[0x12] = bVar2 * auVar8[0x12] | !bVar2 * auVar7[0x12];
  bVar2 = (bool)((byte)(uVar4 >> 0x13) & 1);
  auVar10[0x13] = bVar2 * auVar8[0x13] | !bVar2 * auVar7[0x13];
  bVar2 = (bool)((byte)(uVar4 >> 0x14) & 1);
  auVar10[0x14] = bVar2 * auVar8[0x14] | !bVar2 * auVar7[0x14];
  bVar2 = (bool)((byte)(uVar4 >> 0x15) & 1);
  auVar10[0x15] = bVar2 * auVar8[0x15] | !bVar2 * auVar7[0x15];
  bVar2 = (bool)((byte)(uVar4 >> 0x16) & 1);
  auVar10[0x16] = bVar2 * auVar8[0x16] | !bVar2 * auVar7[0x16];
  bVar2 = (bool)((byte)(uVar4 >> 0x17) & 1);
  auVar10[0x17] = bVar2 * auVar8[0x17] | !bVar2 * auVar7[0x17];
  bVar2 = (bool)((byte)(uVar4 >> 0x18) & 1);
  auVar10[0x18] = bVar2 * auVar8[0x18] | !bVar2 * auVar7[0x18];
  bVar2 = (bool)((byte)(uVar4 >> 0x19) & 1);
  auVar10[0x19] = bVar2 * auVar8[0x19] | !bVar2 * auVar7[0x19];
  bVar2 = (bool)((byte)(uVar4 >> 0x1a) & 1);
  auVar10[0x1a] = bVar2 * auVar8[0x1a] | !bVar2 * auVar7[0x1a];
  bVar2 = (bool)((byte)(uVar4 >> 0x1b) & 1);
  auVar10[0x1b] = bVar2 * auVar8[0x1b] | !bVar2 * auVar7[0x1b];
  bVar2 = (bool)((byte)(uVar4 >> 0x1c) & 1);
  auVar10[0x1c] = bVar2 * auVar8[0x1c] | !bVar2 * auVar7[0x1c];
  bVar2 = (bool)((byte)(uVar4 >> 0x1d) & 1);
  auVar10._30_2_ = auVar8._30_2_;
  auVar10[0x1d] = bVar2 * auVar8[0x1d] | !bVar2 * auVar7[0x1d];
  vpmaddubsw_avx2(auVar20,auVar10);
  vpshufb_avx2(auVar3,get_scale_shuffle_k4_k_shuffle._0_32_);
  halt_baddata();
}

Assistant:

void ggml_vec_dot_iq2_s_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_iq2_s * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)

   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[16] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,};

    const ggml_uint8x16x2_t mask1 = ggml_vld1q_u8_x2(k_mask1);
    const uint8x16_t        mask2 = vld1q_u8(k_mask2);
    const uint8x16_t m1 = vdupq_n_u8(1);
    const int32x4_t vzero = vdupq_n_s32(0);

    uint8x16x2_t vs;
    ggml_int8x16x4_t q2s;
    ggml_int8x16x4_t q8b;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        int sumi1 = 0, sumi2 = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            q8b = ggml_vld1q_s8_x4(q8); q8 += 64;
            q2s.val[0] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[0] | ((qh[ib32+0] << 8) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[1] | ((qh[ib32+0] << 6) & 0x300)))));
            q2s.val[1] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[2] | ((qh[ib32+0] << 4) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[3] | ((qh[ib32+0] << 2) & 0x300)))));
            q2s.val[2] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[4] | ((qh[ib32+1] << 8) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[5] | ((qh[ib32+1] << 6) & 0x300)))));
            q2s.val[3] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[6] | ((qh[ib32+1] << 4) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[7] | ((qh[ib32+1] << 2) & 0x300)))));
            qs += 8;

            vs.val[0] = vreinterpretq_u8_u32(vdupq_n_u32(signs[0] | ((uint32_t) signs[1] << 16)));
            vs.val[1] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[1]), mask2);
            vs.val[0] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[0]), mask2);
            vs.val[0] = vceqq_u8(vs.val[0], mask2);
            vs.val[1] = vceqq_u8(vs.val[1], mask2);

            q2s.val[0] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[0], m1)), q2s.val[0]);
            q2s.val[1] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[1], m1)), q2s.val[1]);

            vs.val[0] = vreinterpretq_u8_u32(vdupq_n_u32(signs[2] | ((uint32_t) signs[3] << 16)));
            vs.val[1] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[1]), mask2);
            vs.val[0] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[0]), mask2);
            vs.val[0] = vceqq_u8(vs.val[0], mask2);
            vs.val[1] = vceqq_u8(vs.val[1], mask2);

            signs += 4;

            q2s.val[2] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[0], m1)), q2s.val[2]);
            q2s.val[3] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[1], m1)), q2s.val[3]);

            const int32x4_t p1 = ggml_vdotq_s32(vzero, q2s.val[0], q8b.val[0]);
            const int32x4_t p2 = ggml_vdotq_s32(vzero, q2s.val[1], q8b.val[1]);
            const int32x4_t p3 = ggml_vdotq_s32(vzero, q2s.val[2], q8b.val[2]);
            const int32x4_t p4 = ggml_vdotq_s32(vzero, q2s.val[3], q8b.val[3]);

            sumi1 += vaddvq_s32(p1) * (1 + 2*(x[i].scales[ib32+0] & 0xf));
            sumi2 += vaddvq_s32(p2) * (1 + 2*(x[i].scales[ib32+0] >>  4));
            sumi1 += vaddvq_s32(p3) * (1 + 2*(x[i].scales[ib32+1] & 0xf));
            sumi2 += vaddvq_s32(p4) * (1 + 2*(x[i].scales[ib32+1] >>  4));
        }
        sumf += d*(sumi1 + sumi2);
    }

    *s = 0.125f * sumf;

#elif defined(__AVX2__)

   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[32] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
                                        0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
    };

    const __m128i m4 = _mm_set1_epi8(0xf);
    const __m128i m1 = _mm_set1_epi8(1);

    const __m256i mask1 = _mm256_loadu_si256((const __m256i*)k_mask1);
    const __m256i mask2 = _mm256_loadu_si256((const __m256i*)k_mask2);

    uint64_t aux64;

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        memcpy(&aux64, x[i].scales, 8);
        const __m128i scales8 = _mm_add_epi8(_mm_slli_epi16(_mm_and_si128(_mm_set_epi64x(aux64 >> 4, aux64), m4), 1), m1);
        const __m256i scales16 = _mm256_cvtepi8_epi16(scales8); // 0 2 4 6 8 10 12 14 1 3 5 7 9 11 13 15

        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q8_2 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q2_1 = _mm256_set_epi64x(iq2s_grid[qs[3] | ((qh[ib32+0] << 2) & 0x300)],
                                                   iq2s_grid[qs[2] | ((qh[ib32+0] << 4) & 0x300)],
                                                   iq2s_grid[qs[1] | ((qh[ib32+0] << 6) & 0x300)],
                                                   iq2s_grid[qs[0] | ((qh[ib32+0] << 8) & 0x300)]);
            const __m256i q2_2 = _mm256_set_epi64x(iq2s_grid[qs[7] | ((qh[ib32+1] << 2) & 0x300)],
                                                   iq2s_grid[qs[6] | ((qh[ib32+1] << 4) & 0x300)],
                                                   iq2s_grid[qs[5] | ((qh[ib32+1] << 6) & 0x300)],
                                                   iq2s_grid[qs[4] | ((qh[ib32+1] << 8) & 0x300)]);
            qs += 8;

            __m256i aux256 = _mm256_set1_epi32(signs[0] | ((uint32_t) signs[1] << 16));
            aux256 = _mm256_and_si256(_mm256_shuffle_epi8(aux256,mask1), mask2);
            const __m256i s2_1 = _mm256_cmpeq_epi8(aux256, mask2);
            const __m256i q8s_1 = _mm256_sub_epi8(_mm256_xor_si256(s2_1, q8_1), s2_1);

            aux256 = _mm256_set1_epi32(signs[2] | ((uint32_t) signs[3] << 16));
            aux256 = _mm256_and_si256(_mm256_shuffle_epi8(aux256,mask1), mask2);
            const __m256i s2_2 = _mm256_cmpeq_epi8(aux256, mask2);
            const __m256i q8s_2 = _mm256_sub_epi8(_mm256_xor_si256(s2_2, q8_2), s2_2);

            signs += 4;

            const __m256i dot1  = _mm256_maddubs_epi16(q2_1, q8s_1); // blocks 2*ib32+0, 2*ib32+1
            const __m256i dot2  = _mm256_maddubs_epi16(q2_2, q8s_2); // blocks 2*ib32+2, 2*ib32+3

            const __m256i p1 = _mm256_madd_epi16(dot1, _mm256_shuffle_epi8(scales16, get_scale_shuffle_k4(ib32+0)));
            const __m256i p2 = _mm256_madd_epi16(dot2, _mm256_shuffle_epi8(scales16, get_scale_shuffle_k4(ib32+1)));
            sumi1 = _mm256_add_epi32(sumi1, p1);
            sumi2 = _mm256_add_epi32(sumi2, p2);
        }

        accumf = _mm256_fmadd_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(_mm256_add_epi32(sumi1, sumi2)), accumf);

    }

    *s = 0.125f * hsum_float_8(accumf);

#elif defined(__AVX__)
   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[32] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
                                        0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
    };

    const __m128i m4 = _mm_set1_epi8(0xf);
    const __m128i m1 = _mm_set1_epi8(1);

    const __m128i mask1_0 = _mm_loadu_si128((const __m128i*)k_mask1);
    const __m128i mask1_1 = _mm_loadu_si128((const __m128i*)k_mask1 + 1);
    const __m128i mask2_0 = _mm_loadu_si128((const __m128i*)k_mask2);
    const __m128i mask2_1 = _mm_loadu_si128((const __m128i*)k_mask2 + 1);

    uint64_t aux64;

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        memcpy(&aux64, x[i].scales, 8);
        const __m128i scales8 = _mm_add_epi8(_mm_slli_epi16(_mm_and_si128(_mm_set_epi64x(aux64 >> 4, aux64), m4), 1), m1);
        const __m128i scales16_0 = _mm_cvtepi8_epi16(scales8);
        const __m128i scales16_1 = _mm_cvtepi8_epi16(_mm_srli_si128(scales8, 8));

        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m128i q8_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q2_1_0 = _mm_set_epi64x(iq2s_grid[qs[1] | ((qh[ib32+0] << 6) & 0x300)],
                                                  iq2s_grid[qs[0] | ((qh[ib32+0] << 8) & 0x300)]);
            const __m128i q2_1_1 = _mm_set_epi64x(iq2s_grid[qs[3] | ((qh[ib32+0] << 2) & 0x300)],
                                                  iq2s_grid[qs[2] | ((qh[ib32+0] << 4) & 0x300)]);
            const __m128i q2_2_0 = _mm_set_epi64x(iq2s_grid[qs[5] | ((qh[ib32+1] << 6) & 0x300)],
                                                  iq2s_grid[qs[4] | ((qh[ib32+1] << 8) & 0x300)]);
            const __m128i q2_2_1 = _mm_set_epi64x(iq2s_grid[qs[7] | ((qh[ib32+1] << 2) & 0x300)],
                                                  iq2s_grid[qs[6] | ((qh[ib32+1] << 4) & 0x300)]);
            qs += 8;

            __m128i aux128_0 = _mm_set1_epi32(signs[0] | ((uint32_t) signs[1] << 16));
            __m128i aux128_1 = aux128_0;
            aux128_0 = _mm_and_si128(_mm_shuffle_epi8(aux128_0,mask1_0), mask2_0);
            aux128_1 = _mm_and_si128(_mm_shuffle_epi8(aux128_1,mask1_1), mask2_1);
            const __m128i s2_1_0 = _mm_cmpeq_epi8(aux128_0, mask2_0);
            const __m128i s2_1_1 = _mm_cmpeq_epi8(aux128_1, mask2_1);
            const __m128i q8s_1_0 = _mm_sub_epi8(_mm_xor_si128(s2_1_0, q8_1_0), s2_1_0);
            const __m128i q8s_1_1 = _mm_sub_epi8(_mm_xor_si128(s2_1_1, q8_1_1), s2_1_1);

            aux128_0 = _mm_set1_epi32(signs[2] | ((uint32_t) signs[3] << 16));
            aux128_1 = aux128_0;
            aux128_0 = _mm_and_si128(_mm_shuffle_epi8(aux128_0,mask1_0), mask2_0);
            aux128_1 = _mm_and_si128(_mm_shuffle_epi8(aux128_1,mask1_1), mask2_1);
            const __m128i s2_2_0 = _mm_cmpeq_epi8(aux128_0, mask2_0);
            const __m128i s2_2_1 = _mm_cmpeq_epi8(aux128_1, mask2_1);
            const __m128i q8s_2_0 = _mm_sub_epi8(_mm_xor_si128(s2_2_0, q8_2_0), s2_2_0);
            const __m128i q8s_2_1 = _mm_sub_epi8(_mm_xor_si128(s2_2_1, q8_2_1), s2_2_1);

            signs += 4;

            const __m128i dot1_0  = _mm_maddubs_epi16(q2_1_0, q8s_1_0);
            const __m128i dot1_1  = _mm_maddubs_epi16(q2_1_1, q8s_1_1);
            const __m128i dot2_0  = _mm_maddubs_epi16(q2_2_0, q8s_2_0);
            const __m128i dot2_1  = _mm_maddubs_epi16(q2_2_1, q8s_2_1);

            const __m128i p1_0 = _mm_madd_epi16(dot1_0, _mm_shuffle_epi8(scales16_0, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+0), 0)));
            const __m128i p1_1 = _mm_madd_epi16(dot1_1, _mm_shuffle_epi8(scales16_1, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+0), 1)));
            const __m128i p2_0 = _mm_madd_epi16(dot2_0, _mm_shuffle_epi8(scales16_0, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+1), 0)));
            const __m128i p2_1 = _mm_madd_epi16(dot2_1, _mm_shuffle_epi8(scales16_1, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+1), 1)));
            sumi1_0 = _mm_add_epi32(sumi1_0, p1_0);
            sumi1_1 = _mm_add_epi32(sumi1_1, p1_1);
            sumi2_0 = _mm_add_epi32(sumi2_0, p2_0);
            sumi2_1 = _mm_add_epi32(sumi2_1, p2_1);
        }

        accumf = _mm256_add_ps(_mm256_mul_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_add_epi32(sumi1_1, sumi2_1), _mm_add_epi32(sumi1_0, sumi2_0)))), accumf);

    }

    *s = 0.125f * hsum_float_8(accumf);

#elif defined(__POWER9_VECTOR__)
    static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                        0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
    };

    static const uint8_t k_mask2[16] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,};

    const vector int v0 = vec_splats((int32_t)0);

    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    const vector unsigned char mask0 = vec_xl( 0, k_mask1);
    const vector unsigned char mask1 = vec_xl(16, k_mask1);
    const vector signed char mask2 = (vector signed char)vec_xl( 0, k_mask2);

    for (int i = 0; i < nb; ++i) {
        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[i].d));
        vector float vyd = vec_splats(y[i].d);
        vector float vd = vec_mul(vxd, vyd);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;

        const uint8_t *  GGML_RESTRICT q2 = x[i].qs;
        const uint8_t *  GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const uint8_t *  GGML_RESTRICT sc = x[i].scales;
        const int8_t  *  GGML_RESTRICT q8 = y[i].qs;

        for (int j = 0; j < QK_K/32; j += 2) {
            __builtin_prefetch(q2, 0, 1);
            __builtin_prefetch(q8, 0, 1);

            vector signed long long aux64x2_0 = {*(const int64_t *)(iq2s_grid + (q2[0] | ((qh[0] << 8) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[1] | ((qh[0] << 6) & 0x300)))};
            vector signed long long aux64x2_1 = {*(const int64_t *)(iq2s_grid + (q2[2] | ((qh[0] << 4) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[3] | ((qh[0] << 2) & 0x300)))};
            vector signed long long aux64x2_2 = {*(const int64_t *)(iq2s_grid + (q2[4] | ((qh[1] << 8) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[5] | ((qh[1] << 6) & 0x300)))};
            vector signed long long aux64x2_3 = {*(const int64_t *)(iq2s_grid + (q2[6] | ((qh[1] << 4) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[7] | ((qh[1] << 2) & 0x300)))};
            q2 += 8;
            qh += 2;

            vector signed char vsigns01 = (vector signed char)vec_splats(*(const uint32_t *)&signs[0]);
            vector signed char vsigns23 = (vector signed char)vec_splats(*(const uint32_t *)&signs[2]);
            signs += 4;

            vector signed char vsigns0 = vec_perm(vsigns01, vsigns01, mask0);
            vector signed char vsigns1 = vec_perm(vsigns01, vsigns01, mask1);
            vector signed char vsigns2 = vec_perm(vsigns23, vsigns23, mask0);
            vector signed char vsigns3 = vec_perm(vsigns23, vsigns23, mask1);

            vsigns0 = (vector signed char)vec_cmpeq(vec_and(vsigns0, mask2), mask2);
            vsigns1 = (vector signed char)vec_cmpeq(vec_and(vsigns1, mask2), mask2);
            vsigns2 = (vector signed char)vec_cmpeq(vec_and(vsigns2, mask2), mask2);
            vsigns3 = (vector signed char)vec_cmpeq(vec_and(vsigns3, mask2), mask2);

            vector signed char q2x0 = vec_sub(vec_xor(vsigns0, (vector signed char)aux64x2_0), vsigns0);
            vector signed char q2x1 = vec_sub(vec_xor(vsigns1, (vector signed char)aux64x2_1), vsigns1);
            vector signed char q2x2 = vec_sub(vec_xor(vsigns2, (vector signed char)aux64x2_2), vsigns2);
            vector signed char q2x3 = vec_sub(vec_xor(vsigns3, (vector signed char)aux64x2_3), vsigns3);

            vector signed char q8y0 = vec_xl( 0, q8);
            vector signed char q8y1 = vec_xl(16, q8);
            vector signed char q8y2 = vec_xl(32, q8);
            vector signed char q8y3 = vec_xl(48, q8);
            q8 += 64;

            vector signed short qv0 = vec_add(vec_mule(q2x0, q8y0), vec_mulo(q2x0, q8y0));
            vector signed short qv1 = vec_add(vec_mule(q2x1, q8y1), vec_mulo(q2x1, q8y1));
            vector signed short qv2 = vec_add(vec_mule(q2x2, q8y2), vec_mulo(q2x2, q8y2));
            vector signed short qv3 = vec_add(vec_mule(q2x3, q8y3), vec_mulo(q2x3, q8y3));

            const uint16_t ls0 = (uint16_t)(sc[0] & 0xf);
            const uint16_t ls1 = (uint16_t)(sc[0] >>  4);
            const uint16_t ls2 = (uint16_t)(sc[1] & 0xf);
            const uint16_t ls3 = (uint16_t)(sc[1] >>  4);
            sc += 2;

            vector signed short vscales0 = vec_splats((int16_t)(2*ls0+1));
            vector signed short vscales1 = vec_splats((int16_t)(2*ls1+1));
            vector signed short vscales2 = vec_splats((int16_t)(2*ls2+1));
            vector signed short vscales3 = vec_splats((int16_t)(2*ls3+1));

            vsumi0 = vec_msum(qv0, vscales0, vsumi0);
            vsumi1 = vec_msum(qv1, vscales1, vsumi1);
            vsumi2 = vec_msum(qv2, vscales2, vsumi2);
            vsumi3 = vec_msum(qv3, vscales3, vsumi3);
        }

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = 0.125f * vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)

   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[32] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
                                        0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
    };


    const __m128i m4 = __lsx_vreplgr2vr_b(0xf);
    const __m128i m1 = __lsx_vreplgr2vr_b(1);

    const __m256i mask1 = __lasx_xvld((const __m256i*)k_mask1, 0);
    const __m256i mask2 = __lasx_xvld((const __m256i*)k_mask2, 0);
    uint64_t aux64;

    __m256 accumf = (__m256)__lasx_xvldi(0);
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        __m128i tmp1;
        memcpy(&aux64, x[i].scales, 8);
        tmp1 = __lsx_vinsgr2vr_d(tmp1, aux64, 0);
        tmp1 = __lsx_vinsgr2vr_d(tmp1, aux64 >> 4, 1);
        const __m128i scales8 = __lsx_vadd_b(__lsx_vslli_h(__lsx_vand_v(tmp1, m4), 1), m1);
        const __m256i scales16 = lasx_ext8_16(scales8); // 0 2 4 6 8 10 12 14 1 3 5 7 9 11 13 15

        __m256i sumi1 = __lasx_xvldi(0);
        __m256i sumi2 = __lasx_xvldi(0);
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q8_2 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q2_1 = lasx_set_d(iq2s_grid[qs[3] | ((qh[ib32+0] << 2) & 0x300)],
                                                   iq2s_grid[qs[2] | ((qh[ib32+0] << 4) & 0x300)],
                                                   iq2s_grid[qs[1] | ((qh[ib32+0] << 6) & 0x300)],
                                                   iq2s_grid[qs[0] | ((qh[ib32+0] << 8) & 0x300)]);
            const __m256i q2_2 = lasx_set_d(iq2s_grid[qs[7] | ((qh[ib32+1] << 2) & 0x300)],
                                                   iq2s_grid[qs[6] | ((qh[ib32+1] << 4) & 0x300)],
                                                   iq2s_grid[qs[5] | ((qh[ib32+1] << 6) & 0x300)],
                                                   iq2s_grid[qs[4] | ((qh[ib32+1] << 8) & 0x300)]);
            qs += 8;

            __m256i aux256 = __lasx_xvreplgr2vr_w(signs[0] | ((uint32_t) signs[1] << 16));
            aux256 = __lasx_xvand_v(lasx_shuffle_b(aux256,mask1), mask2);
            const __m256i s2_1 = __lasx_xvseq_b(aux256, mask2);
            const __m256i q8s_1 = __lasx_xvsub_b(__lasx_xvxor_v(s2_1, q8_1), s2_1);

            aux256 = __lasx_xvreplgr2vr_w(signs[2] | ((uint32_t) signs[3] << 16));
            aux256 = __lasx_xvand_v(lasx_shuffle_b(aux256,mask1), mask2);
            const __m256i s2_2 = __lasx_xvseq_b(aux256, mask2);
            const __m256i q8s_2 = __lasx_xvsub_b(__lasx_xvxor_v(s2_2, q8_2), s2_2);

            signs += 4;

            const __m256i dot1  = lasx_maddubs_h(q2_1, q8s_1); // blocks 2*ib32+0, 2*ib32+1
            const __m256i dot2  = lasx_maddubs_h(q2_2, q8s_2); // blocks 2*ib32+2, 2*ib32+3

            const __m256i p1 = lasx_madd_h(dot1, lasx_shuffle_b(scales16, get_scale_shuffle_k4(ib32+0)));
            const __m256i p2 = lasx_madd_h(dot2, lasx_shuffle_b(scales16, get_scale_shuffle_k4(ib32+1)));
            sumi1 = __lasx_xvadd_w(sumi1, p1);
            sumi2 = __lasx_xvadd_w(sumi2, p2);
        }

        accumf = __lasx_xvfmadd_s(__lasx_xvreplfr2vr_s(d), __lasx_xvffint_s_w(__lasx_xvadd_w(sumi1, sumi2)), accumf);
    }

    *s = 0.125f * hsum_float_8(accumf);

#else

    float sumf = 0;
    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const int8_t  * q8 = y[i].qs;
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = qs + QK_K/8;

        int bsum = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            int ls1 = 1 + 2*(x[i].scales[ib32] & 0xf);
            int ls2 = 1 + 2*(x[i].scales[ib32] >>  4);
            int sumi1 = 0, sumi2 = 0;
            for (int l = 0; l < 2; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    sumi1 += q8[j] * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1 : 1);
                }
                q8 += 8;
            }
            for (int l = 2; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    sumi2 += q8[j] * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1 : 1);
                }
                q8 += 8;
            }
            bsum += ls1 * sumi1 + ls2 * sumi2;
            qs += 4;
            signs += 4;
        }

        sumf += d * bsum;
    }

    *s = 0.125f * sumf;

#endif

}